

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

VkResult __thiscall
VmaAllocator_T::AllocateMemoryOfType
          (VmaAllocator_T *this,VmaPool pool,VkDeviceSize size,VkDeviceSize alignment,
          bool dedicatedPreferred,VkBuffer dedicatedBuffer,VkImage dedicatedImage,
          VkFlags dedicatedBufferImageUsage,VmaAllocationCreateInfo *createInfo,
          uint32_t memTypeIndex,VmaSuballocationType suballocType,
          VmaDedicatedAllocationList *dedicatedAllocations,VmaBlockVector *blockVector,
          size_t allocationCount,VmaAllocation *pAllocations)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  VkResult VVar4;
  undefined4 uVar5;
  byte bVar6;
  undefined1 auVar7 [16];
  VmaAllocationCreateInfo finalCreateInfo;
  
  finalCreateInfo.flags = createInfo->flags;
  finalCreateInfo.usage = createInfo->usage;
  finalCreateInfo.requiredFlags = createInfo->requiredFlags;
  finalCreateInfo.preferredFlags = createInfo->preferredFlags;
  finalCreateInfo.memoryTypeBits = createInfo->memoryTypeBits;
  finalCreateInfo._20_4_ = *(undefined4 *)&createInfo->field_0x14;
  finalCreateInfo.pool = createInfo->pool;
  finalCreateInfo.pUserData = createInfo->pUserData;
  finalCreateInfo.priority = createInfo->priority;
  finalCreateInfo._44_4_ = *(undefined4 *)&createInfo->field_0x2c;
  VVar4 = CalcMemTypeParams(this,&finalCreateInfo,memTypeIndex,size,allocationCount);
  if (VVar4 == VK_SUCCESS) {
    if ((finalCreateInfo._0_8_ & 1) == 0) {
      bVar2 = true;
      if (((finalCreateInfo._0_8_ & 2) == 0) &&
         ((pool == (VmaPool)0x0 || ((blockVector->m_ExplicitBlockSize & 1U) == 0)))) {
        cVar3 = '\x01';
        if (size <= blockVector->m_PreferredBlockSize >> 1) {
          cVar3 = dedicatedPreferred;
        }
        dedicatedPreferred = (bool)cVar3;
        uVar1 = (this->m_DeviceMemoryCount).super___atomic_base<unsigned_int>._M_i;
        if ((this->m_PhysicalDeviceProperties).limits.maxMemoryAllocationCount * 3 >> 2 < uVar1) {
          dedicatedPreferred = false;
        }
        if (dedicatedPreferred == true) {
          auVar7._0_4_ = -(uint)((finalCreateInfo._0_8_ & 0x200) != 0);
          auVar7._4_4_ = -(uint)((finalCreateInfo._0_8_ & 0xc00) != 0);
          auVar7._8_4_ = -(uint)((finalCreateInfo._0_8_ & 0x20) != 0);
          auVar7._12_4_ = -(uint)((finalCreateInfo._0_8_ & 4) != 0);
          uVar5 = movmskps(uVar1,auVar7);
          bVar6 = (byte)uVar5;
          VVar4 = AllocateDedicatedMemory
                            (this,pool,size,suballocType,dedicatedAllocations,memTypeIndex,
                             (bool)(bVar6 >> 3),(bool)((bVar6 & 4) >> 2),(bool)((bVar6 & 2) >> 1),
                             (bool)(bVar6 & 1),finalCreateInfo.pUserData,finalCreateInfo.priority,
                             dedicatedBuffer,dedicatedImage,dedicatedBufferImageUsage,
                             allocationCount,pAllocations,blockVector->m_pMemoryAllocateNext);
          if (VVar4 == VK_SUCCESS) {
            return VK_SUCCESS;
          }
          bVar2 = false;
        }
        else {
          bVar2 = false;
        }
      }
      VVar4 = VmaBlockVector::Allocate
                        (blockVector,size,alignment,&finalCreateInfo,suballocType,allocationCount,
                         pAllocations);
      if (VVar4 == VK_SUCCESS || bVar2) {
        return VVar4;
      }
      if (dedicatedPreferred != false) {
        return VVar4;
      }
    }
    VVar4 = AllocateDedicatedMemory
                      (this,pool,size,suballocType,dedicatedAllocations,memTypeIndex,
                       SUB41((finalCreateInfo.flags & 4) >> 2,0),
                       SUB41((finalCreateInfo.flags & 0x20) >> 5,0),
                       (finalCreateInfo.flags & 0xc00) != 0,
                       (bool)((byte)(finalCreateInfo.flags >> 9) & 1),finalCreateInfo.pUserData,
                       finalCreateInfo.priority,dedicatedBuffer,dedicatedImage,
                       dedicatedBufferImageUsage,allocationCount,pAllocations,
                       blockVector->m_pMemoryAllocateNext);
  }
  return VVar4;
}

Assistant:

VkResult VmaAllocator_T::AllocateMemoryOfType(
    VmaPool pool,
    VkDeviceSize size,
    VkDeviceSize alignment,
    bool dedicatedPreferred,
    VkBuffer dedicatedBuffer,
    VkImage dedicatedImage,
    VkFlags dedicatedBufferImageUsage,
    const VmaAllocationCreateInfo& createInfo,
    uint32_t memTypeIndex,
    VmaSuballocationType suballocType,
    VmaDedicatedAllocationList& dedicatedAllocations,
    VmaBlockVector& blockVector,
    size_t allocationCount,
    VmaAllocation* pAllocations)
{
    VMA_ASSERT(pAllocations != VMA_NULL);
    VMA_DEBUG_LOG("  AllocateMemory: MemoryTypeIndex=%u, AllocationCount=%zu, Size=%llu", memTypeIndex, allocationCount, size);

    VmaAllocationCreateInfo finalCreateInfo = createInfo;
    VkResult res = CalcMemTypeParams(
        finalCreateInfo,
        memTypeIndex,
        size,
        allocationCount);
    if(res != VK_SUCCESS)
        return res;

    if((finalCreateInfo.flags & VMA_ALLOCATION_CREATE_DEDICATED_MEMORY_BIT) != 0)
    {
        return AllocateDedicatedMemory(
            pool,
            size,
            suballocType,
            dedicatedAllocations,
            memTypeIndex,
            (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_MAPPED_BIT) != 0,
            (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_USER_DATA_COPY_STRING_BIT) != 0,
            (finalCreateInfo.flags &
                (VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT)) != 0,
            (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_CAN_ALIAS_BIT) != 0,
            finalCreateInfo.pUserData,
            finalCreateInfo.priority,
            dedicatedBuffer,
            dedicatedImage,
            dedicatedBufferImageUsage,
            allocationCount,
            pAllocations,
            blockVector.GetAllocationNextPtr());
    }
    else
    {
        const bool canAllocateDedicated =
            (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_NEVER_ALLOCATE_BIT) == 0 &&
            (pool == VK_NULL_HANDLE || !blockVector.HasExplicitBlockSize());

        if(canAllocateDedicated)
        {
            // Heuristics: Allocate dedicated memory if requested size if greater than half of preferred block size.
            if(size > blockVector.GetPreferredBlockSize() / 2)
            {
                dedicatedPreferred = true;
            }
            // Protection against creating each allocation as dedicated when we reach or exceed heap size/budget,
            // which can quickly deplete maxMemoryAllocationCount: Don't prefer dedicated allocations when above
            // 3/4 of the maximum allocation count.
            if(m_DeviceMemoryCount.load() > m_PhysicalDeviceProperties.limits.maxMemoryAllocationCount * 3 / 4)
            {
                dedicatedPreferred = false;
            }

            if(dedicatedPreferred)
            {
                res = AllocateDedicatedMemory(
                    pool,
                    size,
                    suballocType,
                    dedicatedAllocations,
                    memTypeIndex,
                    (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_MAPPED_BIT) != 0,
                    (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_USER_DATA_COPY_STRING_BIT) != 0,
                    (finalCreateInfo.flags &
                        (VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT)) != 0,
                    (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_CAN_ALIAS_BIT) != 0,
                    finalCreateInfo.pUserData,
                    finalCreateInfo.priority,
                    dedicatedBuffer,
                    dedicatedImage,
                    dedicatedBufferImageUsage,
                    allocationCount,
                    pAllocations,
                    blockVector.GetAllocationNextPtr());
                if(res == VK_SUCCESS)
                {
                    // Succeeded: AllocateDedicatedMemory function already filld pMemory, nothing more to do here.
                    VMA_DEBUG_LOG("    Allocated as DedicatedMemory");
                    return VK_SUCCESS;
                }
            }
        }

        res = blockVector.Allocate(
            size,
            alignment,
            finalCreateInfo,
            suballocType,
            allocationCount,
            pAllocations);
        if(res == VK_SUCCESS)
            return VK_SUCCESS;

        // Try dedicated memory.
        if(canAllocateDedicated && !dedicatedPreferred)
        {
            res = AllocateDedicatedMemory(
                pool,
                size,
                suballocType,
                dedicatedAllocations,
                memTypeIndex,
                (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_MAPPED_BIT) != 0,
                (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_USER_DATA_COPY_STRING_BIT) != 0,
                (finalCreateInfo.flags &
                    (VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT)) != 0,
                (finalCreateInfo.flags & VMA_ALLOCATION_CREATE_CAN_ALIAS_BIT) != 0,
                finalCreateInfo.pUserData,
                finalCreateInfo.priority,
                dedicatedBuffer,
                dedicatedImage,
                dedicatedBufferImageUsage,
                allocationCount,
                pAllocations,
                blockVector.GetAllocationNextPtr());
            if(res == VK_SUCCESS)
            {
                // Succeeded: AllocateDedicatedMemory function already filld pMemory, nothing more to do here.
                VMA_DEBUG_LOG("    Allocated as DedicatedMemory");
                return VK_SUCCESS;
            }
        }
        // Everything failed: Return error code.
        VMA_DEBUG_LOG("    vkAllocateMemory FAILED");
        return res;
    }
}